

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O2

bool sptk::ConvertStringToInteger(string *input,int *output)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  char *end;
  
  bVar2 = false;
  if (output != (int *)0x0) {
    end = (char *)0x0;
    bVar2 = false;
    if (input->_M_string_length != 0) {
      lVar4 = strtol((input->_M_dataplus)._M_p,&end,10);
      pcVar1 = end;
      iVar3 = std::__cxx11::string::compare((char *)input);
      if (((iVar3 == 0) || (*pcVar1 != '\0')) || (piVar5 = __errno_location(), *piVar5 == 0x22)) {
        bVar2 = false;
      }
      else {
        *output = (int)lVar4;
        bVar2 = true;
      }
    }
  }
  return bVar2;
}

Assistant:

bool ConvertStringToInteger(const std::string& input, int* output) {
  if (input.empty() || NULL == output) {
    return false;
  }

  char* end;
  int converted_value(static_cast<int>(std::strtol(input.c_str(), &end, 10)));

  if (0 == input.compare(end) || '\0' != *end || ERANGE == errno) {
    return false;
  }

  *output = converted_value;
  return true;
}